

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

int gdImageColorExactAlpha(gdImagePtr im,int r,int g,int b,int a)

{
  ulong uVar1;
  ulong uVar2;
  
  if (im->trueColor != 0) {
    return b + a * 0x1000000 + g * 0x100 + r * 0x10000;
  }
  uVar1 = 0;
  uVar2 = (ulong)(uint)im->colorsTotal;
  if (im->colorsTotal < 1) {
    uVar2 = uVar1;
  }
  while( true ) {
    if (uVar2 == uVar1) {
      return -1;
    }
    if ((((im->open[uVar1] == 0) && (im->red[uVar1] == r)) && (im->green[uVar1] == g)) &&
       ((im->blue[uVar1] == b && (im->alpha[uVar1] == a)))) break;
    uVar1 = uVar1 + 1;
  }
  return (int)uVar1;
}

Assistant:

BGD_DECLARE(int) gdImageColorExactAlpha (gdImagePtr im, int r, int g, int b, int a)
{
	int i;
	if (im->trueColor) {
		return gdTrueColorAlpha (r, g, b, a);
	}
	for (i = 0; (i < (im->colorsTotal)); i++) {
		if (im->open[i]) {
			continue;
		}
		if ((im->red[i] == r) &&
		        (im->green[i] == g) && (im->blue[i] == b) && (im->alpha[i] == a)) {
			return i;
		}
	}
	return -1;
}